

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ExistingFileNamer::getApprovedFile(ExistingFileNamer *this,string *extensionWithDot)

{
  element_type *peVar1;
  string *in_RDX;
  string *in_RDI;
  Options *in_stack_ffffffffffffff78;
  string local_48 [72];
  
  Options::getNamer(in_stack_ffffffffffffff78);
  peVar1 = ::std::
           __shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2046cd);
  ::std::__cxx11::string::string(local_48,in_RDX);
  (*peVar1->_vptr_ApprovalNamer[2])(in_RDI,peVar1,local_48);
  ::std::__cxx11::string::~string(local_48);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x204711);
  return in_RDI;
}

Assistant:

std::string ExistingFileNamer::getApprovedFile(std::string extensionWithDot) const
    {
        return options_.getNamer()->getApprovedFile(extensionWithDot);
    }